

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O2

vector<char,_std::allocator<char>_> *
convertToUTF8(vector<char,_std::allocator<char>_> *__return_storage_ptr__,
             vector<char,_std::allocator<char>_> *data)

{
  uint *puVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint *__s1;
  allocator_type local_31;
  
  puVar1 = (uint *)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  pcVar2 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar5 = (long)pcVar2 - (long)puVar1;
  __s1 = (uint *)0x0;
  if (uVar5 != 0) {
    __s1 = puVar1;
  }
  if (uVar5 < 4) {
    if (uVar5 < 2) goto LAB_0010fc61;
    uVar3 = (uint)(ushort)*__s1;
  }
  else {
    uVar3 = *__s1;
    if (uVar3 == 0xfffe0000) {
      convertToUTF8Impl<UTF32Decoder<true>>(__return_storage_ptr__,(char *)(__s1 + 1),uVar5 - 4);
      return __return_storage_ptr__;
    }
    if (uVar3 == 0xfeff) {
      convertToUTF8Impl<UTF32Decoder<false>>(__return_storage_ptr__,(char *)(__s1 + 1),uVar5 - 4);
      return __return_storage_ptr__;
    }
  }
  if ((short)uVar3 == -2) {
    convertToUTF8Impl<UTF16Decoder<true>>(__return_storage_ptr__,(char *)((long)__s1 + 2),uVar5 - 2)
    ;
    return __return_storage_ptr__;
  }
  if ((uVar3 & 0xffff) == 0xfeff) {
    convertToUTF8Impl<UTF16Decoder<false>>
              (__return_storage_ptr__,(char *)((long)__s1 + 2),uVar5 - 2);
    return __return_storage_ptr__;
  }
  if ((2 < uVar5) && (iVar4 = bcmp(__s1,anon_var_dwarf_2e805,3), iVar4 == 0)) {
    std::vector<char,std::allocator<char>>::vector<char_const*,void>
              ((vector<char,std::allocator<char>> *)__return_storage_ptr__,(char *)((long)__s1 + 3),
               (char *)(uVar5 + (long)__s1),&local_31);
    return __return_storage_ptr__;
  }
LAB_0010fc61:
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar1;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = pcVar2;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> convertToUTF8(std::vector<char> data)
{
	const char* contents = data.empty() ? 0 : &data[0];
	size_t size = data.size();

	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0x0000feff) return convertToUTF8Impl<UTF32Decoder<false>>(contents + 4, size - 4);
	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0xfffe0000) return convertToUTF8Impl<UTF32Decoder<true>>(contents + 4, size - 4);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfeff) return convertToUTF8Impl<UTF16Decoder<false>>(contents + 2, size - 2);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfffe) return convertToUTF8Impl<UTF16Decoder<true>>(contents + 2, size - 2);
	if (size >= 3 && memcmp(contents, "\xef\xbb\xbf", 3) == 0) return std::vector<char>(contents + 3, contents + size);

	return data;
}